

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

void __thiscall
FIX::ScreenLogFactory::ScreenLogFactory(ScreenLogFactory *this,SessionSettings *settings)

{
  SessionSettings *settings_local;
  ScreenLogFactory *this_local;
  
  LogFactory::LogFactory((LogFactory *)this);
  *(undefined **)this = &Message::typeinfo;
  this[8] = (ScreenLogFactory)0x0;
  this[9] = (ScreenLogFactory)0x0;
  this[10] = (ScreenLogFactory)0x0;
  this[0xb] = (ScreenLogFactory)0x1;
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x10),settings);
  return;
}

Assistant:

explicit ScreenLogFactory(SessionSettings settings)
      : m_useSettings(true),
        m_settings(std::move(settings)) {}